

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_assertion_tests.cpp
# Opt level: O2

void ExceptionFunction(int i)

{
  undefined8 *puVar1;
  string *this;
  undefined *puVar2;
  allocator<char> local_11;
  
  switch(i) {
  case 1:
    puVar1 = (undefined8 *)__cxa_allocate_exception(4);
    *(undefined4 *)puVar1 = 2;
    puVar2 = &int::typeinfo;
    break;
  case 2:
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = std::__cxx11::string::replace;
    __cxa_throw(puVar1,&std::bad_exception::typeinfo,std::bad_exception::~bad_exception);
  case 3:
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = "error";
    puVar2 = &char_const*::typeinfo;
    break;
  case 4:
    this = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>(this,"error",&local_11);
    __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  case 5:
    puVar1 = (undefined8 *)__cxa_allocate_exception(4);
    *(undefined4 *)puVar1 = 0x3dcccccd;
    puVar2 = &float::typeinfo;
    break;
  default:
    return;
  }
  __cxa_throw(puVar1,puVar2,0);
}

Assistant:

static void ExceptionFunction(int i)
{
    switch( i )
    {
    case 0:
        return;
    case 1:
        throw 2;
    case 2:
        throw ::std::bad_exception();
    case 3:
        throw "error";
    case 4:
        throw ::std::string("error");
    case 5:
        throw 0.1f;
    case -1:
        {
            int* p = reinterpret_cast<int*>(0x1234);
            *p = 1;
        }
        break;
    default:
        break;
    }
}